

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::AssertSnapEquiv_SnapScriptFunctionInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  bool condition;
  SnapScriptFunctionInfo *str1;
  SnapScriptFunctionInfo *str2;
  
  str1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)4>
                   (sobj1);
  str2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)4>
                   (sobj2);
  condition = TTStringEQForDiagnostics(&str1->DebugFunctionName,&str2->DebugFunctionName);
  TTDCompareMap::DiagnosticAssert(compareMap,condition);
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_FunctionBody
            (compareMap,str1->BodyRefId,str2->BodyRefId);
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
            (compareMap,str1->ScopeId,str2->ScopeId,L"scopes");
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
            (compareMap,str1->CachedScopeObjId,str2->CachedScopeObjId,L"cachedScopeObj");
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
            (compareMap,str1->HomeObjId,str2->HomeObjId,L"homeObject");
  NSSnapValues::AssertSnapEquivTTDVar_Special
            (str1->ComputedNameInfo,str2->ComputedNameInfo,compareMap,L"computedName");
  return;
}

Assistant:

void AssertSnapEquiv_SnapScriptFunctionInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapScriptFunctionInfo* snapFuncInfo1 = SnapObjectGetAddtlInfoAs<SnapScriptFunctionInfo*, SnapObjectType::SnapScriptFunctionObject>(sobj1);
            const SnapScriptFunctionInfo* snapFuncInfo2 = SnapObjectGetAddtlInfoAs<SnapScriptFunctionInfo*, SnapObjectType::SnapScriptFunctionObject>(sobj2);

            compareMap.DiagnosticAssert(TTStringEQForDiagnostics(snapFuncInfo1->DebugFunctionName, snapFuncInfo2->DebugFunctionName));

            compareMap.CheckConsistentAndAddPtrIdMapping_FunctionBody(snapFuncInfo1->BodyRefId, snapFuncInfo2->BodyRefId);
            compareMap.CheckConsistentAndAddPtrIdMapping_Special(snapFuncInfo1->ScopeId, snapFuncInfo2->ScopeId, _u("scopes"));

            compareMap.CheckConsistentAndAddPtrIdMapping_Special(snapFuncInfo1->CachedScopeObjId, snapFuncInfo2->CachedScopeObjId, _u("cachedScopeObj"));
            compareMap.CheckConsistentAndAddPtrIdMapping_Special(snapFuncInfo1->HomeObjId, snapFuncInfo2->HomeObjId, _u("homeObject"));

            NSSnapValues::AssertSnapEquivTTDVar_Special(snapFuncInfo1->ComputedNameInfo, snapFuncInfo2->ComputedNameInfo, compareMap, _u("computedName"));
        }